

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void recmult(double *A,double *B,double *C,int m,int n,int p,int sA,int sB,int sC)

{
  int m_00;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int p_00;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  int m_local;
  double *C_local;
  double *B_local;
  
  uVar4 = (ulong)(uint)p;
  uVar1 = (ulong)(uint)m;
  _m_local = C;
  C_local = B;
LAB_0011b77e:
  do {
    m_00 = (int)uVar1;
    while( true ) {
      p_00 = (int)uVar4;
      if (n + m_00 + p_00 < 0xc1) {
        if (0 < m_00) {
          uVar5 = 0;
          do {
            if (0 < p_00) {
              lVar2 = uVar5 * (long)sC;
              uVar9 = 0;
              pdVar6 = C_local;
              do {
                if (0 < n) {
                  dVar10 = _m_local[lVar2 + uVar9];
                  uVar3 = 0;
                  pdVar8 = pdVar6;
                  do {
                    dVar10 = dVar10 + A[uVar3] * *pdVar8;
                    _m_local[lVar2 + uVar9] = dVar10;
                    uVar3 = uVar3 + 1;
                    pdVar8 = pdVar8 + sC;
                  } while ((uint)n != uVar3);
                }
                uVar9 = uVar9 + 1;
                pdVar6 = pdVar6 + 1;
              } while (uVar9 != uVar4);
            }
            uVar5 = uVar5 + 1;
            A = A + sB;
          } while (uVar5 != uVar1);
        }
        return;
      }
      if ((n <= m_00) && (p_00 <= m_00)) {
        dVar10 = ceil((double)m_00 * 0.5);
        iVar7 = (int)dVar10;
        recmult(A,C_local,_m_local,iVar7,n,p_00,sA,sB,sC);
        A = A + iVar7 * sB;
        uVar1 = (ulong)(uint)(m_00 - iVar7);
        _m_local = _m_local + iVar7 * sC;
        goto LAB_0011b77e;
      }
      if ((m_00 <= n) && (p_00 <= n)) break;
      if (p_00 < m_00) {
        return;
      }
      if (p_00 < n) {
        return;
      }
      dVar10 = ceil((double)p_00 * 0.5);
      iVar7 = (int)dVar10;
      recmult(A,C_local,_m_local,m_00,n,iVar7,sA,sB,sC);
      C_local = C_local + iVar7;
      _m_local = _m_local + iVar7;
      uVar4 = (ulong)(uint)(p_00 - iVar7);
    }
    dVar10 = ceil((double)n * 0.5);
    iVar7 = (int)dVar10;
    recmult(A,C_local,_m_local,m_00,iVar7,p_00,sA,sB,sC);
    A = A + iVar7;
    n = n - iVar7;
    C_local = C_local + iVar7 * sC;
  } while( true );
}

Assistant:

void recmult(double* A, double* B, double* C,int m,int n, int p,int sA,int sB, int sC) {
	int m2,n2,p2;
	register int i,j,k;
	int u,v,t;
	if (m + n + p <= CUTOFF) {
		//#pragma omp parallel for private(i,j,k,v,u,t)
		for (i = 0; i < m; ++i) {
			for (j = 0; j < p; ++j) {
				v = i * sB;
				u = i * sC;
				t = j + u;
				for (k = 0; k < n;++k) {
					C[t] += A[k + v] * B[j + k * sC];
				}
			}
		}

		
	} else if (m >= n && m >= p) {
		m2 = (int) ceil((double) m / 2.0);
		recmult(A,B,C,m2,n,p,sA,sB,sC);
		recmult(A + m2*sB,B,C + m2*sC,m-m2,n,p,sA,sB,sC);
		
	} else if (n >= m && n >= p) {
		n2 = (int) ceil((double) n / 2.0);
		recmult(A,B,C,m,n2,p,sA,sB,sC);
		recmult(A+n2,B+n2*sC,C,m,n-n2,p,sA,sB,sC);
		
	} else if (p >= m && p >= n) {
		p2 = (int) ceil((double) p / 2.0);
		recmult(A,B,C,m,n,p2,sA,sB,sC);
		recmult(A,B+p2,C+p2,m,n,p-p2,sA,sB,sC);
	}
}